

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_device.c
# Opt level: O2

void on_event_send_complete_messenger_callback
               (IOTHUB_MESSAGE_LIST *iothub_message,
               TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT ev_send_comp_result,void *context)

{
  LOGGER_LOG p_Var1;
  undefined4 uVar2;
  
  if (iothub_message == (IOTHUB_MESSAGE_LIST *)0x0 || context == (void *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_device.c"
                ,"on_event_send_complete_messenger_callback",0xb0,1,
                "on_event_send_complete_messenger_callback was invoked, but either iothub_message (%p) or context (%p) are NULL"
                ,iothub_message,context);
    }
  }
  else {
    if (ev_send_comp_result <
        (TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_MESSENGER_DESTROYED|
        TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT_ERROR_FAIL_SENDING)) {
      uVar2 = *(undefined4 *)(&DAT_00193f8c + (ulong)ev_send_comp_result * 4);
    }
    else {
      uVar2 = 5;
    }
    if (*context != (code *)0x0) {
      (**context)(iothub_message,uVar2,*(undefined8 *)((long)context + 8));
    }
  }
  free(context);
  return;
}

Assistant:

static void on_event_send_complete_messenger_callback(IOTHUB_MESSAGE_LIST* iothub_message, TELEMETRY_MESSENGER_EVENT_SEND_COMPLETE_RESULT ev_send_comp_result, void* context)
{
    DEVICE_SEND_EVENT_TASK* send_task = (DEVICE_SEND_EVENT_TASK*)context;
    if (iothub_message == NULL || send_task == NULL)
    {
        LogError("on_event_send_complete_messenger_callback was invoked, but either iothub_message (%p) or context (%p) are NULL", iothub_message, send_task);
    }
    else
    {
        D2C_EVENT_SEND_RESULT device_send_result = get_d2c_event_send_result_from(ev_send_comp_result);

        if (send_task->on_event_send_complete_callback != NULL)
        {
            send_task->on_event_send_complete_callback(iothub_message, device_send_result, send_task->on_event_send_complete_context);
        }
    }

    if (send_task)
    {
        free(send_task);
    }
}